

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int CVodeQuadSensSStolerances(void *cvode_mem,sunrealtype reltolQS,sunrealtype *abstolQS)

{
  double *pdVar1;
  sunrealtype *psVar2;
  int *piVar3;
  long in_RSI;
  CVodeMem in_RDI;
  double in_XMM0_Qa;
  int is;
  CVodeMem cv_mem;
  int local_2c;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x97c,"CVodeQuadSensSStolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_SensMallocDone == 0) {
    cvProcessError(in_RDI,-0x28,0x985,"CVodeQuadSensSStolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"Forward sensitivity analysis not activated.");
    local_4 = -0x28;
  }
  else if (in_RDI->cv_QuadSensMallocDone == 0) {
    cvProcessError(in_RDI,-0x32,0x98e,"CVodeQuadSensSStolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"Forward sensitivity analysis for quadrature variables not activated.");
    local_4 = -0x1e;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if (in_RSI == 0) {
      cvProcessError(in_RDI,-0x16,0x99e,"CVodeQuadSensSStolerances",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"abstolQS = NULL illegal.");
      local_4 = -0x16;
    }
    else {
      for (local_2c = 0; local_2c < in_RDI->cv_Ns; local_2c = local_2c + 1) {
        pdVar1 = (double *)(in_RSI + (long)local_2c * 8);
        if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
          cvProcessError(in_RDI,-0x16,0x9a7,"CVodeQuadSensSStolerances",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                         ,"abstolQS has negative component(s) (illegal).");
          return -0x16;
        }
      }
      in_RDI->cv_itolQS = 1;
      in_RDI->cv_reltolQS = in_XMM0_Qa;
      if (in_RDI->cv_SabstolQSMallocDone == 0) {
        in_RDI->cv_SabstolQS = (sunrealtype *)0x0;
        psVar2 = (sunrealtype *)malloc((long)in_RDI->cv_Ns << 3);
        in_RDI->cv_SabstolQS = psVar2;
        piVar3 = (int *)malloc((long)in_RDI->cv_Ns << 2);
        in_RDI->cv_atolQSmin0 = piVar3;
        in_RDI->cv_lrw = (long)in_RDI->cv_Ns + in_RDI->cv_lrw;
        in_RDI->cv_SabstolQSMallocDone = 1;
      }
      for (local_2c = 0; local_2c < in_RDI->cv_Ns; local_2c = local_2c + 1) {
        in_RDI->cv_SabstolQS[local_2c] = *(sunrealtype *)(in_RSI + (long)local_2c * 8);
        in_RDI->cv_atolQSmin0[local_2c] = (uint)(*(double *)(in_RSI + (long)local_2c * 8) == 0.0);
      }
      local_4 = 0;
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,0x997,"CVodeQuadSensSStolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"reltolQS < 0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeQuadSensSStolerances(void* cvode_mem, sunrealtype reltolQS,
                              sunrealtype* abstolQS)
{
  CVodeMem cv_mem;
  int is;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Check if sensitivity was initialized */

  if (cv_mem->cv_SensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  /* Ckeck if quadrature sensitivity was initialized? */

  if (cv_mem->cv_QuadSensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUADSENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUADSENSI);
    return (CV_NO_QUAD);
  }

  /* Test user-supplied tolerances */

  if (reltolQS < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_RELTOLQS);
    return (CV_ILL_INPUT);
  }

  if (abstolQS == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_ABSTOLQS);
    return (CV_ILL_INPUT);
  }

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    if (abstolQS[is] < ZERO)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSGCV_BAD_ABSTOLQS);
      return (CV_ILL_INPUT);
    }
  }

  /* Copy tolerances into memory */

  cv_mem->cv_itolQS = CV_SS;

  cv_mem->cv_reltolQS = reltolQS;

  if (!(cv_mem->cv_SabstolQSMallocDone))
  {
    cv_mem->cv_SabstolQS = NULL;
    cv_mem->cv_SabstolQS =
      (sunrealtype*)malloc(cv_mem->cv_Ns * sizeof(sunrealtype));
    cv_mem->cv_atolQSmin0 =
      (sunbooleantype*)malloc(cv_mem->cv_Ns * sizeof(sunbooleantype));
    cv_mem->cv_lrw += cv_mem->cv_Ns;
    cv_mem->cv_SabstolQSMallocDone = SUNTRUE;
  }

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    cv_mem->cv_SabstolQS[is]  = abstolQS[is];
    cv_mem->cv_atolQSmin0[is] = (abstolQS[is] == ZERO);
  }

  return (CV_SUCCESS);
}